

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::EnforceStringStyle::visit(EnforceStringStyle *this,LiteralString *lit)

{
  int iVar1;
  int iVar2;
  UString *__range2;
  long lVar3;
  bool bVar4;
  UString canonical;
  UString local_68;
  UString local_48;
  
  if (2 < lit->tokenKind - BLOCK) {
    if (lit->tokenKind == RAW_DESUGARED) {
      __assert_fail("lit->tokenKind != LiteralString::RAW_DESUGARED",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                    ,0x292,
                    "virtual void jsonnet::internal::EnforceStringStyle::visit(LiteralString *)");
    }
    jsonnet_string_unescape(&local_68,&(lit->super_AST).location,&lit->value);
    iVar2 = 0;
    iVar1 = 0;
    for (lVar3 = 0; local_68._M_string_length << 2 != lVar3; lVar3 = lVar3 + 4) {
      iVar1 = iVar1 + (uint)(*(int *)((long)local_68._M_dataplus._M_p + lVar3) == 0x27);
      iVar2 = iVar2 + (uint)(*(int *)((long)local_68._M_dataplus._M_p + lVar3) == 0x22);
    }
    if (iVar1 == 0 || iVar2 == 0) {
      bVar4 = (this->super_FmtPass).opts.stringStyle == 's';
      jsonnet_string_escape(&local_48,&local_68,bVar4 && iVar1 == 0 || iVar2 != 0);
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      operator=(&lit->value,&local_48);
      std::__cxx11::u32string::~u32string((u32string *)&local_48);
      lit->tokenKind = (uint)((!bVar4 || iVar1 != 0) && iVar2 == 0);
    }
    std::__cxx11::u32string::~u32string((u32string *)&local_68);
  }
  return;
}

Assistant:

void visit(LiteralString *lit)
    {
        assert(lit->tokenKind != LiteralString::RAW_DESUGARED);
        if (lit->tokenKind == LiteralString::BLOCK)
            return;
        if (lit->tokenKind == LiteralString::VERBATIM_DOUBLE)
            return;
        if (lit->tokenKind == LiteralString::VERBATIM_SINGLE)
            return;
        UString canonical = jsonnet_string_unescape(lit->location, lit->value);
        unsigned num_single = 0, num_double = 0;
        for (char32_t c : canonical) {
            if (c == '\'')
                num_single++;
            if (c == '"')
                num_double++;
        }
        if (num_single > 0 && num_double > 0)
            return;  // Don't change it.
        bool use_single = opts.stringStyle == 's';
        if (num_single > 0)
            use_single = false;
        if (num_double > 0)
            use_single = true;

        // Change it.
        lit->value = jsonnet_string_escape(canonical, use_single);
        lit->tokenKind = use_single ? LiteralString::SINGLE : LiteralString::DOUBLE;
    }